

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O1

void __thiscall
TPZSparseBlockDiagonal<double>::TPZSparseBlockDiagonal
          (TPZSparseBlockDiagonal<double> *this,TPZVec<long> *blockgraph,
          TPZVec<long> *blockgraphindex,int64_t rows,int color,TPZVec<int> *colors)

{
  TPZVec<int> *this_00;
  long newsize;
  int *piVar1;
  long *plVar2;
  int *piVar3;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  int64_t iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int64_t newsize_00;
  long lVar13;
  
  TPZBlockDiagonal<double>::TPZBlockDiagonal
            (&this->super_TPZBlockDiagonal<double>,&PTR_PTR_0187fc20);
  (this->super_TPZBlockDiagonal<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZSparseBlockDiagonal_0187f9a0;
  (this->fBlock)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->fBlock).fStore = (long *)0x0;
  (this->fBlock).fNElements = 0;
  (this->fBlock).fNAlloc = 0;
  (this->fBlockIndex)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->fBlockIndex).fStore = (long *)0x0;
  (this->fBlockIndex).fNElements = 0;
  (this->fBlockIndex).fNAlloc = 0;
  lVar11 = blockgraphindex->fNElements;
  newsize = lVar11 + -1;
  this_00 = &(this->super_TPZBlockDiagonal<double>).fBlockSize;
  TPZVec<int>::Resize(this_00,newsize);
  if (lVar11 < 2) {
    newsize_00 = 1;
    iVar8 = 0;
  }
  else {
    piVar1 = colors->fStore;
    plVar2 = blockgraphindex->fStore;
    piVar3 = (this->super_TPZBlockDiagonal<double>).fBlockSize.fStore;
    lVar9 = 0;
    iVar8 = 0;
    lVar12 = 0;
    do {
      if (piVar1[lVar9] == color) {
        iVar10 = (int)plVar2[lVar9 + 1] - (int)plVar2[lVar9];
        piVar3[lVar12] = iVar10;
        lVar12 = lVar12 + 1;
        iVar8 = iVar8 + iVar10;
      }
      lVar9 = lVar9 + 1;
    } while (newsize != lVar9);
    newsize_00 = lVar12 + 1;
  }
  TPZVec<long>::Resize(&this->fBlock,iVar8);
  TPZVec<long>::Resize(&this->fBlockIndex,newsize_00);
  plVar2 = (this->fBlockIndex).fStore;
  *plVar2 = 0;
  if (lVar11 < 2) {
    iVar8 = 0;
  }
  else {
    piVar1 = colors->fStore;
    plVar4 = blockgraphindex->fStore;
    piVar3 = (this->super_TPZBlockDiagonal<double>).fBlockSize.fStore;
    plVar5 = (this->fBlock).fStore;
    plVar6 = blockgraph->fStore;
    lVar11 = 0;
    iVar8 = 0;
    do {
      if (piVar1[lVar11] == color) {
        lVar9 = plVar4[lVar11];
        lVar12 = plVar4[lVar11 + 1];
        lVar7 = plVar2[iVar8];
        plVar2[iVar8 + 1] = piVar3[iVar8] + lVar7;
        iVar8 = iVar8 + 1;
        if (lVar9 < lVar12) {
          lVar13 = 0;
          do {
            plVar5[lVar7 + lVar13] = plVar6[lVar9 + lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar12 - lVar9 != lVar13);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != newsize);
  }
  TPZVec<int>::Resize(this_00,iVar8);
  TPZBlockDiagonal<double>::Initialize(&this->super_TPZBlockDiagonal<double>,this_00);
  (this->super_TPZBlockDiagonal<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = rows;
  (this->super_TPZBlockDiagonal<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = rows;
  return;
}

Assistant:

TPZSparseBlockDiagonal<TVar>::TPZSparseBlockDiagonal(TPZVec<int64_t> &blockgraph, TPZVec<int64_t> &blockgraphindex,int64_t rows, int color, TPZVec<int> &colors) : TPZRegisterClassId(&TPZSparseBlockDiagonal::ClassId)
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "Constructor of TPZSparseBlockDiagonal");
#endif
	int64_t numbl = blockgraphindex.NElements()-1;
	this->fBlockSize.Resize(numbl);
	int64_t ibl,iblcount,graphsize = 0;
	for(ibl=0, iblcount=0; ibl<numbl; ibl++)
	{
		if(colors[ibl]==color) 
		{
			this->fBlockSize[iblcount++] = blockgraphindex[ibl+1]-blockgraphindex[ibl];
			graphsize += this->fBlockSize[iblcount-1];
		}
	}
	fBlock.Resize(graphsize);
	fBlockIndex.Resize(iblcount+1);
	fBlockIndex[0] = 0;
	for(ibl=0, iblcount=0; ibl<numbl; ibl++)
	{
		if(colors[ibl]==color) 
		{
			int64_t first = blockgraphindex[ibl];
			int64_t last = blockgraphindex[ibl+1];
			int64_t firstcp = fBlockIndex[iblcount];
			this->fBlockIndex[iblcount+1] = firstcp+this->fBlockSize[iblcount];
			//      int lastcp = fBlockIndex[iblcount+1];
			int64_t ieq,ieqcp;
			for(ieq=first,ieqcp=firstcp; ieq<last; ieq++,ieqcp++)
			{
				fBlock[ieqcp] = blockgraph[ieq];
			}
			iblcount++;
		}
	}
	this->fBlockSize.Resize(iblcount);
	this->Initialize(this->fBlockSize);
	this->fRow = rows;
	this->fCol = rows;
}